

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O3

bool spvtools::utils::ParseNumber<unsigned_int>(char *text,uint *value_pointer)

{
  uint *puVar1;
  size_t sVar2;
  bool bVar3;
  istringstream text_stream;
  long *local_1c8 [2];
  long local_1b8 [2];
  long local_1a8 [3];
  uint auStack_190 [24];
  ios_base local_130 [264];
  
  if (text == (char *)0x0) {
    return false;
  }
  local_1c8[0] = local_1b8;
  sVar2 = strlen(text);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,text,text + sVar2);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1a8,(string *)local_1c8,_S_in);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
  *puVar1 = *puVar1 & 0xffffffb5;
  std::istream::_M_extract<unsigned_int>((uint *)local_1a8);
  if ((*text != '\0') &&
     ((*(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18) + 8) & 7) == 2)) {
    bVar3 = true;
    if ((*text != '-') || (*value_pointer == 0)) goto LAB_00183b4b;
    *value_pointer = 0;
  }
  bVar3 = false;
LAB_00183b4b:
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1a8);
  std::ios_base::~ios_base(local_130);
  return bVar3;
}

Assistant:

bool ParseNumber(const char* text, T* value_pointer) {
  // C++11 doesn't define std::istringstream(int8_t&), so calling this method
  // with a single-byte type leads to implementation-defined behaviour.
  // Similarly for uint8_t.
  static_assert(sizeof(T) > 1,
                "Single-byte types are not supported in this parse method");

  if (!text) return false;
  std::istringstream text_stream(text);
  // Allow both decimal and hex input for integers.
  // It also allows octal input, but we don't care about that case.
  text_stream >> std::setbase(0);
  text_stream >> *value_pointer;

  // We should have read something.
  bool ok = (text[0] != 0) && !text_stream.bad();
  // It should have been all the text.
  ok = ok && text_stream.eof();
  // It should have been in range.
  ok = ok && !text_stream.fail();

  // Work around a bug in the GNU C++11 library. It will happily parse
  // "-1" for uint16_t as 65535.
  if (ok && text[0] == '-')
    ok = !ClampToZeroIfUnsignedType<T>::Clamp(value_pointer);

  return ok;
}